

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption(UninterpretedOption *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_003ba128;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->name_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_UninterpretedOption_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_UninterpretedOption_google_2fprotobuf_2fdescriptor_2eproto.base)
    ;
  }
  (this->identifier_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->string_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->aggregate_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->positive_int_value_ = 0;
  this->negative_int_value_ = 0;
  this->double_value_ = 0.0;
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena),
  name_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.UninterpretedOption)
}